

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

double __thiscall HDual::an_bs_cond(HDual *this,HModel *ptr_model)

{
  HVector *this_00;
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  vector<double,_std::allocator<double>_> *this_01;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  ulong uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  
  this->model = ptr_model;
  this->matrix = &ptr_model->matrix;
  piVar3 = (ptr_model->matrix).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (ptr_model->matrix).Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = &this->bs_cond_x;
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_y,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_z,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_w,(long)this->numRow);
  auVar22 = _DAT_001570a0;
  iVar12 = this->numRow;
  if (0 < (long)iVar12) {
    pdVar5 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)iVar12 + -1;
    auVar18._8_4_ = (int)lVar10;
    auVar18._0_8_ = lVar10;
    auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar18 = auVar18 ^ _DAT_001570a0;
    auVar20 = _DAT_00157090;
    do {
      auVar25 = auVar20 ^ auVar22;
      if ((bool)(~(auVar25._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar25._0_4_ ||
                  auVar18._4_4_ < auVar25._4_4_) & 1)) {
        *(double *)((long)pdVar5 + lVar10) = 1.0 / (double)iVar12;
      }
      if ((auVar25._12_4_ != auVar18._12_4_ || auVar25._8_4_ <= auVar18._8_4_) &&
          auVar25._12_4_ <= auVar18._12_4_) {
        *(double *)((long)pdVar5 + lVar10 + 8) = 1.0 / (double)iVar12;
      }
      lVar13 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar13 + 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar12 + 1U >> 1) << 4 != lVar10);
  }
  this_00 = &this->row_ep;
  HVector::clear(this_00);
  iVar12 = this->numRow;
  (this->row_ep).count = iVar12;
  if (0 < iVar12) {
    pdVar5 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      piVar6[lVar10] = (int)lVar10;
      pdVar7[lVar10] = pdVar5[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numRow);
  }
  iVar12 = 1;
  while( true ) {
    (this->row_ep).packFlag = false;
    HFactor::ftran(this->factor,this_00,1.0);
    iVar2 = this->numRow;
    if (0 < (long)iVar2) {
      pdVar5 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->bs_cond_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->bs_cond_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        dVar24 = pdVar5[lVar10];
        pdVar7[lVar10] = dVar24;
        if (dVar24 <= 0.0) {
          if (0.0 <= dVar24) {
            pdVar8[lVar10] = 0.0;
          }
          else {
            pdVar8[lVar10] = -1.0;
          }
        }
        else {
          pdVar8[lVar10] = 1.0;
        }
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
    HVector::clear(this_00);
    iVar2 = this->numRow;
    (this->row_ep).count = iVar2;
    if (0 < iVar2) {
      pdVar5 = (this->bs_cond_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        piVar6[lVar10] = (int)lVar10;
        pdVar7[lVar10] = pdVar5[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->numRow);
    }
    (this->row_ep).packFlag = false;
    HFactor::btran(this->factor,this_00,1.0);
    iVar2 = this->numRow;
    uVar11 = (ulong)iVar2;
    if ((long)uVar11 < 1) {
      iVar15 = -1;
      dVar24 = 0.0;
      dVar23 = 0.0;
      dVar17 = 0.0;
    }
    else {
      pdVar5 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->bs_cond_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->bs_cond_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = 0xffffffff;
      dVar17 = 0.0;
      uVar14 = 0;
      dVar23 = 0.0;
      auVar22 = (undefined1  [16])0x0;
      uVar19 = (ulong)DAT_001570c0;
      do {
        dVar1 = pdVar5[uVar14];
        dVar24 = (double)((ulong)dVar1 & uVar19);
        dVar21 = auVar22._0_8_;
        if (dVar21 < dVar24) {
          uVar16 = uVar14 & 0xffffffff;
        }
        iVar15 = (int)uVar16;
        pdVar7[uVar14] = dVar1;
        if (dVar24 <= dVar21) {
          dVar24 = dVar21;
        }
        dVar23 = dVar23 + dVar1 * pdVar8[uVar14];
        dVar17 = dVar17 + (double)((ulong)pdVar9[uVar14] & uVar19);
        uVar14 = uVar14 + 1;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar24;
      } while (uVar11 != uVar14);
    }
    if (dVar24 <= dVar23) break;
    if (0 < iVar2) {
      memset((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,0,uVar11 << 3);
    }
    HVector::clear(this_00);
    (this->row_ep).count = 1;
    *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar15;
    (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = 1.0;
    (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = 1.0;
    if ((dVar24 <= dVar23) || (iVar12 = iVar12 + 1, iVar12 == 6)) break;
  }
  if ((long)this->numRow < 1) {
    dVar24 = 0.0;
  }
  else {
    dVar24 = 0.0;
    lVar10 = 0;
    do {
      iVar12 = (this->model->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      dVar23 = 1.0;
      if (iVar12 < this->numCol) {
        iVar2 = piVar3[iVar12];
        lVar13 = (long)iVar2;
        iVar12 = piVar3[(long)iVar12 + 1];
        dVar23 = 0.0;
        if (iVar2 < iVar12) {
          do {
            dVar23 = dVar23 + ABS(pdVar4[lVar13]);
            lVar13 = lVar13 + 1;
          } while (iVar12 != lVar13);
        }
      }
      if (dVar24 <= dVar23) {
        dVar24 = dVar23;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != this->numRow);
  }
  return dVar17 * dVar24;
}

Assistant:

double HDual::an_bs_cond(HModel *ptr_model) {
  model = ptr_model;
  // Alias to the matrix
  matrix = model->getMatrix();
  const int *Astart = matrix->getAstart();
  const double *Avalue = matrix->getAvalue();
  //Compute the Hager condition number estimate for the basis matrix
  double NoDensity = 1;
  bs_cond_x.resize(numRow);
  bs_cond_y.resize(numRow);
  bs_cond_z.resize(numRow);
  bs_cond_w.resize(numRow);
  //x = ones(n,1)/n;
  //y = A\x;
  double mu = 1.0/numRow;
  double norm_Binv;
  for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = mu;
  row_ep.clear();
  row_ep.count = numRow;
  for (int r_n=0; r_n < numRow; r_n++) {
    row_ep.index[r_n] = r_n;
    row_ep.array[r_n] = bs_cond_x[r_n];
  }
  for (int ps_n=1; ps_n <= 5; ps_n++) {
    row_ep.packFlag = false;
    factor->ftran(row_ep, NoDensity);
  //zeta = sign(y);
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_y[r_n] = row_ep.array[r_n];
      if (bs_cond_y[r_n] > 0)
	bs_cond_w[r_n] =  1.0;
      else if (bs_cond_y[r_n] < 0)
	bs_cond_w[r_n] = -1.0;
      else	  
        bs_cond_w[r_n] =  0.0;
    }
  //z=A'\zeta;
    row_ep.clear();
    row_ep.count = numRow;
    for (int r_n=0; r_n < numRow; r_n++) {
      row_ep.index[r_n] = r_n;
      row_ep.array[r_n] = bs_cond_w[r_n];
    }
    row_ep.packFlag = false;
    factor->btran(row_ep, NoDensity);
  //norm_z = norm(z,'inf');
  //ztx = z'*x ;
  //NormEst = norm(y,1);
  //fd_i = 0;
  //for i=1:n
  //    if abs(z(i)) == norm_z
  //        fd_i = i;
  //        break
  //    end
  //end
    double norm_z = 0.0;
    double ztx = 0.0;
    norm_Binv = 0.0;
    int argmax_z = -1;
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_z[r_n] = row_ep.array[r_n];
      double abs_z_v = abs(bs_cond_z[r_n]);
	if (abs_z_v > norm_z) {
	  norm_z = abs_z_v;
	  argmax_z = r_n;
	}
      ztx += bs_cond_z[r_n]*bs_cond_x[r_n];
      norm_Binv += abs(bs_cond_y[r_n]);
    }
    //printf("%2d: ||z||_inf = %8.2g; z^T*x = %8.2g; ||y||_1 = %g\n", ps_n, norm_z, ztx, norm_Binv);
    if (norm_z <= ztx) break;
  //x = zeros(n,1);
  //x(fd_i) = 1;
    for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = 0.0;
    row_ep.clear();
    row_ep.count = 1;
    row_ep.index[0] = argmax_z;
    row_ep.array[argmax_z] = 1.0;
    bs_cond_x[argmax_z] = 1.0;
  }
  double norm_B = 0.0;
  for (int r_n=0; r_n < numRow; r_n++) {
    int vr_n = model->getBaseIndex()[r_n];
    double c_norm = 0.0;
    if (vr_n < numCol) 
      for (int el_n=Astart[vr_n]; el_n < Astart[vr_n+1]; el_n++) c_norm += abs(Avalue[el_n]);
    else 
      c_norm += 1.0;
    norm_B = max(c_norm, norm_B);
  }
  double cond_B = norm_Binv * norm_B;
 // printf("Hager estimate of ||B^{-1}||_1 = %g; ||B||_1 = %g so cond_1(B) estimate is %g\n", norm_Binv, norm_B, cond_B);
  return cond_B;
}